

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicAtomicCase3::Run(BasicAtomicCase3 *this)

{
  CallLogWrapper *this_00;
  undefined8 *puVar1;
  uint uVar2;
  bool bVar3;
  GLuint GVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  GLuint u;
  GLint i;
  string local_d8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar3 = ShaderStorageBufferObjectBase::SupportedInVS((ShaderStorageBufferObjectBase *)this,1);
  lVar7 = 0x10;
  if ((bVar3) &&
     (bVar3 = ShaderStorageBufferObjectBase::SupportedInGS((ShaderStorageBufferObjectBase *)this,1),
     bVar3)) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,
               "\nlayout(location = 0) in vec4 g_in_position;\nlayout(std430, binding = 0) buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_vs_buffer;\nvoid main() {\n  gl_Position = g_in_position;\n  atomicAdd(g_vs_buffer.u[0].x, g_vs_buffer.u[gl_VertexID][1]);\n  atomicAdd(g_vs_buffer.u[0][0], g_vs_buffer.u[gl_VertexID].z);\n  atomicAdd(g_vs_buffer.i[0].x, g_vs_buffer.i[gl_VertexID][1]);\n  atomicAdd(g_vs_buffer.i[0][0], g_vs_buffer.i[gl_VertexID].z);\n}"
               ,"");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,0x1b32ab9);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,0x1b32ab9);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout(std430, binding = 0) buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_gs_buffer;\nvoid main() {\n  gl_Position = gl_in[0].gl_Position;\n  gl_PrimitiveID = gl_PrimitiveIDIn;\n  EmitVertex();\n  atomicAdd(g_gs_buffer.u[0].x, g_gs_buffer.u[gl_PrimitiveIDIn][1]);\n  atomicAdd(g_gs_buffer.i[0].x, g_gs_buffer.i[gl_PrimitiveIDIn][1]);\n}"
               ,"");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "\nlayout(location = 0) out vec4 g_fs_out;\nlayout(std430, binding = 0) buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_fs_buffer;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n  atomicAdd(g_fs_buffer.u[0].x, g_fs_buffer.u[gl_PrimitiveID][1]);\n  atomicAdd(g_fs_buffer.i[0].x, g_fs_buffer.i[gl_PrimitiveID][1]);\n}"
               ,"");
    GVar4 = ShaderStorageBufferObjectBase::CreateProgram
                      ((ShaderStorageBufferObjectBase *)this,&local_d8,&local_b0,&local_50,&local_70
                       ,&local_90);
    *(GLuint *)&(this->super_ComputeShaderBase).renderTarget = GVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram
              (this_00,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
    bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                      ((ShaderStorageBufferObjectBase *)this,
                       *(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
    lVar7 = -1;
    if (bVar3) {
      glu::CallLogWrapper::glGenBuffers
                (this_00,1,(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
      glu::CallLogWrapper::glBindBufferBase
                (this_00,0x90d2,0,
                 *(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x80,(void *)0x0,0x88e8);
      pvVar5 = glu::CallLogWrapper::glMapBuffer(this_00,0x90d2,0x88b9);
      if (pvVar5 != (void *)0x0) {
        lVar6 = 0;
        do {
          *(undefined8 *)((long)pvVar5 + lVar6) = 0x100000000;
          ((undefined8 *)((long)pvVar5 + lVar6))[1] = 2;
          puVar1 = (undefined8 *)((long)pvVar5 + lVar6 + 0x10);
          *puVar1 = 0x100000000;
          puVar1[1] = 2;
          lVar6 = lVar6 + 0x20;
        } while (lVar6 != 0x80);
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        if (pvVar5 != (void *)0x0) {
          local_d8.field_2._M_allocated_capacity = 0x3f4ccccdbf4ccccd;
          local_d8.field_2._8_8_ = 0x3f4ccccd3f4ccccd;
          local_d8._M_dataplus._M_p = (pointer)0xbf4ccccdbf4ccccd;
          local_d8._M_string_length = 0xbf4ccccd3f4ccccd;
          glu::CallLogWrapper::glGenBuffers
                    (this_00,1,(GLuint *)((long)&(this->super_ComputeShaderBase).pixelFormat + 4));
          glu::CallLogWrapper::glBindBuffer
                    (this_00,0x8892,
                     *(GLuint *)((long)&(this->super_ComputeShaderBase).pixelFormat + 4));
          glu::CallLogWrapper::glBufferData(this_00,0x8892,0x20,&local_d8,0x88e4);
          glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
          glu::CallLogWrapper::glGenVertexArrays
                    (this_00,1,(GLuint *)&(this->super_ComputeShaderBase).pixelFormat);
          glu::CallLogWrapper::glBindVertexArray
                    (this_00,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat);
          glu::CallLogWrapper::glBindBuffer
                    (this_00,0x8892,
                     *(GLuint *)((long)&(this->super_ComputeShaderBase).pixelFormat + 4));
          glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
          glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
          glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
          glu::CallLogWrapper::glBindVertexArray(this_00,0);
          glu::CallLogWrapper::glClear(this_00,0x4000);
          glu::CallLogWrapper::glUseProgram
                    (this_00,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
          glu::CallLogWrapper::glBindVertexArray
                    (this_00,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat);
          glu::CallLogWrapper::glDrawArrays(this_00,0,0,4);
          glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
          glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&local_d8);
          uVar2 = (uint)local_d8._M_dataplus._M_p;
          if ((uint)local_d8._M_dataplus._M_p == 0x14) {
            glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0x40,4,&local_b0);
            uVar2 = (uint)local_b0._M_dataplus._M_p;
            if ((uint)local_b0._M_dataplus._M_p == 0x14) {
              return 0;
            }
          }
          anon_unknown_0::Output("Data at offset 0 is %d should be %d.\n",(ulong)uVar2,0x14);
          lVar7 = -1;
        }
      }
    }
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		if (!RunIteration(uvec3(64, 1, 1), false))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 64), true))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 4), false))
			return ERROR;
		if (!RunIteration(uvec3(3, 2, 1), true))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 2), false))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 7), true))
			return ERROR;
		return NO_ERROR;
	}